

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPSources::GotoFirstSourceWithData(RTPSources *this)

{
  bool bVar1;
  bool bVar2;
  RTPInternalSourceData **ppRVar3;
  bool local_29;
  RTPInternalSourceData *srcdat;
  bool found;
  RTPSources *this_local;
  
  bVar1 = false;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while( true ) {
    local_29 = false;
    if (bVar1 == false) {
      local_29 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                 ::HasCurrentElement(&this->sourcelist);
    }
    if (local_29 == false) break;
    ppRVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    bVar2 = RTPSourceData::HasData(&(*ppRVar3)->super_RTPSourceData);
    if (bVar2) {
      bVar1 = true;
    }
    else {
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::GotoNextElement(&this->sourcelist);
    }
  }
  return bVar1;
}

Assistant:

bool RTPSources::GotoFirstSourceWithData()
{
	bool found = false;
	
	sourcelist.GotoFirstElement();
	while (!found && sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat;

		srcdat = sourcelist.GetCurrentElement();
		if (srcdat->HasData())
			found = true;
		else
			sourcelist.GotoNextElement();
	}
			
	return found;
}